

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  char *pcVar6;
  char *in_RSI;
  char c;
  char *buf;
  lword caddr;
  int ret;
  char c_00;
  undefined8 in_stack_ffffffffffffffa0;
  lword *in_stack_ffffffffffffffa8;
  lword in_stack_ffffffffffffffb0;
  char local_39;
  uint local_24;
  uint local_4;
  
  c_00 = (char)((ulong)in_stack_ffffffffffffffa0 >> 0x18);
  local_24 = 1;
  *in_RSI = '\0';
  local_39 = getchr();
  if (local_39 != ':') {
    if (local_39 != '(') {
      back(1);
      parse_expr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_24 = 3;
      local_39 = getchr();
    }
    if ((local_39 == '(') && (pcVar6 = getword(), pcVar6 != (char *)0x0)) {
      strcpy(in_RSI,pcVar6);
      cVar2 = getchr();
      pcVar6 = scriptname;
      if (cVar2 != ')') {
        uVar3 = getlineno();
        error(0x42,pcVar6,(ulong)uVar3,0x29);
        back(1);
        local_24 = 0;
      }
      local_39 = getchr();
    }
  }
  if (local_39 == ':') {
    pcVar6 = getword();
    if (pcVar6 != (char *)0x0) {
      iVar4 = strcmp(pcVar6,"AT");
      pcVar1 = scriptname;
      if (iVar4 == 0) {
        cVar2 = getchr();
        if (cVar2 == '(') {
          parse_expr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          if (local_24 != 0) {
            local_24 = local_24 | 4;
          }
          cVar2 = getchr();
          if (cVar2 != ')') {
            pcVar6 = scriptname;
            uVar3 = getlineno();
            error(0x42,pcVar6,(ulong)uVar3,0x29);
            back(1);
            local_24 = 0;
          }
        }
        else {
          pcVar6 = scriptname;
          uVar3 = getlineno();
          error(0x42,pcVar6,(ulong)uVar3,0x28);
          c_00 = (char)((ulong)pcVar6 >> 0x18);
          back(1);
          local_24 = 0;
        }
      }
      else {
        uVar3 = getlineno();
        error(0x41,pcVar1,(ulong)uVar3,pcVar6);
      }
    }
    bVar5 = startofblock(c_00);
    if (bVar5 == 0) {
      local_24 = 0;
    }
    local_4 = local_24;
  }
  else {
    pcVar6 = scriptname;
    uVar3 = getlineno();
    error(0x42,pcVar6,(ulong)uVar3,0x3a);
    back(1);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)
/* Parse syntax of section definition until '{' and return VMA address,
   LMA address and type, when given.
   Returns bitfield. 0 when syntax is incorrect, 1 for correct,
   3 for s_addr set, 5 for s_lma set and 7 for both.
   Syntax: [addr-expr] [(type)] : [AT(lma)] { */
{
  int ret = 1;
  lword caddr = -2; /* this prevents expression evaluation during pre-parse */
  char *buf,c;

  if (current_ls)
    caddr = current_ls->relocmem->current;

  *s_type = 0;

  c = getchr();
  if (c != ':') {
    if (c != '(') {
      back(1);
      parse_expr(caddr,s_addr);
#if 0 /* @@@ not needed? address must be within memory region */
      if (current_ls) {
        if (current_ls->relocmem != defmem) {
          /* warning: address overrides specified VMA memory region */
          error(76,scriptname,getlineno(),'V');
          current_ls->relocmem = defmem;
        }
      }
#endif
      ret |= 2;
      c = getchr();
    }
    if (c == '(') {
      if (buf = getword()) {
        strcpy(s_type,buf);
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
        c = getchr();
      }
    }
  }

  if (c != ':') {
    error(66,scriptname,getlineno(),':');  /* ':' expected */
    back(1);
    return 0;
  }

  if (buf = getword()) {
    if (!strcmp(buf,"AT")) {
      if (getchr()=='(') {
        parse_expr(caddr,s_lma);
#if 0 /* @@@ not needed? address must be within memory region */
        if (current_ls) {
          if (current_ls->destmem != defmem) {
            if (current_ls->destmem != current_ls->relocmem) {
              /* warning: address overrides specified LMA memory region */
              error(76,scriptname,getlineno(),'L');
            }
            current_ls->destmem = atdefmem;
          }
        }
#endif
        if (ret)
          ret |= 4;
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        ret = 0;
      }
    }
    else
      error(65,scriptname,getlineno(),buf);  /* unknown keyword ignored */
  }

  if (!startofblock('{'))
    ret = 0;

  return ret;
}